

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::LookupBucketFor<DBKeyID>
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DBKeyID *Val,DenseMapPair<DBKeyID,_llbuild::core::KeyID> **FoundBucket)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar6;
  uint uVar7;
  ulong uVar8;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar9;
  int iVar10;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar6 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
LAB_00169031:
    bVar3 = false;
  }
  else {
    uVar1 = Val->value;
    if (0xfffffffffffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, LookupKeyT = DBKeyID]"
                   );
    }
    lVar2 = *(long *)this;
    uVar4 = *(int *)(this + 0x10) - 1;
    uVar8 = (ulong)((int)uVar1 * 0x25 & uVar4);
    pDVar6 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)(lVar2 + uVar8 * 0x10);
    uVar5 = *(ulong *)(lVar2 + uVar8 * 0x10);
    bVar3 = true;
    if (uVar1 != uVar5) {
      iVar10 = 1;
      pDVar9 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
      do {
        if (uVar5 == 0xffffffffffffffff) {
          if (pDVar9 != (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
            pDVar6 = pDVar9;
          }
          goto LAB_00169031;
        }
        if (uVar5 == 0xfffffffffffffffe &&
            pDVar9 == (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
          pDVar9 = pDVar6;
        }
        uVar7 = (int)uVar8 + iVar10;
        iVar10 = iVar10 + 1;
        uVar8 = (ulong)(uVar7 & uVar4);
        pDVar6 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)(lVar2 + uVar8 * 0x10);
        uVar5 = *(ulong *)(lVar2 + uVar8 * 0x10);
      } while (uVar1 != uVar5);
    }
  }
  *FoundBucket = pDVar6;
  return bVar3;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }